

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPUImpl.hpp
# Opt level: O0

void __thiscall
beagle::cpu::BeagleCPUImpl<float,_1,_0>::threadWaiting
          (BeagleCPUImpl<float,_1,_0> *this,threadData *tData)

{
  threadData *in_RSI;
  packaged_task<void_()> j;
  unique_lock<std::mutex> l;
  packaged_task<void_()> *in_stack_ffffffffffffffa8;
  unique_lock<std::mutex> *in_stack_ffffffffffffffb0;
  condition_variable *in_stack_ffffffffffffffb8;
  anon_class_8_1_a89cf95e this_00;
  unique_lock<std::mutex> local_20;
  anon_class_8_1_a89cf95e local_10;
  
  local_10.tData = in_RSI;
  std::unique_lock<std::mutex>::unique_lock(&local_20,&in_RSI->m);
  while( true ) {
    std::unique_lock<std::mutex>::lock(in_stack_ffffffffffffffb0);
    this_00.tData = local_10.tData;
    std::condition_variable::
    wait<beagle::cpu::BeagleCPUImpl<float,1,0>::threadWaiting(beagle::cpu::BeagleCPUImpl<float,1,0>::threadData*)::_lambda()_1_>
              (in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,local_10);
    if (((local_10.tData)->stop & 1U) != 0) break;
    std::
    queue<std::packaged_task<void_()>,_std::deque<std::packaged_task<void_()>,_std::allocator<std::packaged_task<void_()>_>_>_>
    ::front((queue<std::packaged_task<void_()>,_std::deque<std::packaged_task<void_()>,_std::allocator<std::packaged_task<void_()>_>_>_>
             *)0x1add8f);
    std::packaged_task<void_()>::packaged_task
              ((packaged_task<void_()> *)in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
    std::
    queue<std::packaged_task<void_()>,_std::deque<std::packaged_task<void_()>,_std::allocator<std::packaged_task<void_()>_>_>_>
    ::pop((queue<std::packaged_task<void_()>,_std::deque<std::packaged_task<void_()>,_std::allocator<std::packaged_task<void_()>_>_>_>
           *)0x1addaa);
    std::unique_lock<std::mutex>::unlock(in_stack_ffffffffffffffb0);
    std::packaged_task<void_()>::operator()((packaged_task<void_()> *)in_stack_ffffffffffffffb0);
    std::packaged_task<void_()>::~packaged_task((packaged_task<void_()> *)this_00.tData);
  }
  std::unique_lock<std::mutex>::~unique_lock(in_stack_ffffffffffffffb0);
  return;
}

Assistant:

BEAGLE_CPU_TEMPLATE
void BeagleCPUImpl<BEAGLE_CPU_GENERIC>::threadWaiting(threadData* tData)
{
    std::unique_lock<std::mutex> l(tData->m, std::defer_lock);
    while (true)
    {
        l.lock();

        // Wait until the queue won't be empty or stop is signaled
        tData->cv.wait(l, [tData] () {
            return (tData->stop || !tData->jobs.empty());
            });

        // Stop was signaled, let's exit the thread
        if (tData->stop) { return; }

        // Pop one task from the queue...
        std::packaged_task<void()> j = std::move(tData->jobs.front());
        tData->jobs.pop();

        l.unlock();

        // Execute the task!
        j();
    }
}